

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void notationDeclDebug(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.notationDecl(%s, %s, %s)\n",name,publicId,systemId);
  return;
}

Assistant:

static void
notationDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	     const xmlChar *publicId, const xmlChar *systemId)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.notationDecl(%s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId);
}